

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rfc-1123_type.h
# Opt level: O0

bool date::rfc1123::validate(parts *dt)

{
  byte bVar1;
  byte bVar2;
  week_day wVar3;
  int iVar4;
  date local_1e;
  parts *ppStack_18;
  week_day week_day;
  parts *dt_local;
  
  if (dt->year == 0) {
    dt_local._7_1_ = false;
  }
  else if ((dt->month == '\0') || (0xc < dt->month)) {
    dt_local._7_1_ = false;
  }
  else if ((dt->day == '\0') ||
          (bVar1 = dt->day, ppStack_18 = dt,
          bVar2 = calendar_helper::days_in_month(dt->year,dt->month), bVar2 < bVar1)) {
    dt_local._7_1_ = false;
  }
  else if (ppStack_18->hour < 0x18) {
    if (ppStack_18->minute < 0x3c) {
      if (ppStack_18->second < 0x3c) {
        iVar4 = (int)ppStack_18->offset_in_minutes;
        if (iVar4 < 1) {
          iVar4 = -iVar4;
        }
        if (iVar4 < 0x1798) {
          if (ppStack_18->week_day != '\0') {
            calendar_helper::date::date
                      (&local_1e,ppStack_18->year,ppStack_18->month,ppStack_18->day);
            wVar3 = calendar_helper::day_of_week(&local_1e);
            if (ppStack_18->week_day != wVar3) {
              return false;
            }
          }
          dt_local._7_1_ = true;
        }
        else {
          dt_local._7_1_ = false;
        }
      }
      else {
        dt_local._7_1_ = false;
      }
    }
    else {
      dt_local._7_1_ = false;
    }
  }
  else {
    dt_local._7_1_ = false;
  }
  return dt_local._7_1_;
}

Assistant:

static bool validate(const parts& dt)
    {
        if (dt.year == 0)
            return false;
        if (dt.month == 0 || dt.month > 12)
            return false;
        if (dt.day == 0 || dt.day > calendar_helper::days_in_month(dt.year, dt.month))
            return false;
        if (dt.hour > 23)
            return false;
        if (dt.minute > 59)
            return false;
        if (dt.second > 59)
            return false;
        if (std::abs(dt.offset_in_minutes) > 6039)
            return false;
        if (dt.week_day != 0)
        {
            const auto week_day = calendar_helper::day_of_week(calendar_helper::date{ dt.year, dt.month, dt.day });
            if (dt.week_day != week_day)
                return false;
        }
        return true;
    }